

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O3

int accumulate_fit(float *flr,float *mdct,int x0,int x1,lsfit_acc *a,int n,vorbis_info_floor1 *info)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  
  a->x2b = 0;
  a->y2b = 0;
  a->xyb = 0;
  a->bn = 0;
  a->xya = 0;
  a->an = 0;
  a->xb = 0;
  a->yb = 0;
  a->xa = 0;
  a->ya = 0;
  a->x2a = 0;
  a->y2a = 0;
  a->x0 = x0;
  a->x1 = x1;
  iVar5 = n + -1;
  if (x1 < n) {
    iVar5 = x1;
  }
  iVar11 = 0;
  iVar3 = 0;
  iVar10 = 0;
  iVar12 = 0;
  local_5c = 0;
  iVar1 = 0;
  local_58 = 0;
  local_54 = 0;
  local_50 = 0;
  local_4c = 0;
  local_48 = 0;
  local_44 = 0;
  if (x0 <= iVar5) {
    lVar2 = (long)x0;
    lVar8 = 0;
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    local_50 = 0;
    local_54 = 0;
    local_58 = 0;
    iVar1 = 0;
    local_5c = 0;
    iVar12 = 0;
    iVar10 = 0;
    iVar3 = 0;
    iVar11 = 0;
    do {
      iVar6 = (int)(flr[lVar2 + lVar8] * 7.3142858 + 1023.5);
      iVar9 = iVar6;
      if (iVar6 < 1) {
        iVar9 = 0;
      }
      if (0x3fe < iVar9) {
        iVar9 = 0x3ff;
      }
      if (0 < iVar6) {
        iVar6 = (int)lVar8;
        iVar7 = (x0 + iVar6) * (x0 + iVar6);
        iVar4 = (x0 + iVar6) * iVar9;
        if (flr[lVar2 + lVar8] <= mdct[lVar2 + lVar8] + info->twofitatten) {
          iVar11 = iVar11 + x0 + iVar6;
          iVar3 = iVar3 + iVar9;
          iVar10 = iVar10 + iVar7;
          iVar12 = iVar12 + iVar9 * iVar9;
          local_5c = local_5c + iVar4;
          iVar1 = iVar1 + 1;
        }
        else {
          local_58 = local_58 + x0 + iVar6;
          local_54 = local_54 + iVar9;
          local_50 = local_50 + iVar7;
          local_4c = local_4c + iVar9 * iVar9;
          local_48 = local_48 + iVar4;
          local_44 = local_44 + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while ((iVar5 - lVar2) + 1 != lVar8);
  }
  a->xa = iVar11;
  a->ya = iVar3;
  a->x2a = iVar10;
  a->y2a = iVar12;
  a->xya = local_5c;
  a->an = iVar1;
  a->xb = local_58;
  a->yb = local_54;
  a->x2b = local_50;
  a->y2b = local_4c;
  a->xyb = local_48;
  a->bn = local_44;
  return iVar1;
}

Assistant:

static int accumulate_fit(const float *flr,const float *mdct,
                          int x0, int x1,lsfit_acc *a,
                          int n,vorbis_info_floor1 *info){
  long i;

  int xa=0,ya=0,x2a=0,y2a=0,xya=0,na=0, xb=0,yb=0,x2b=0,y2b=0,xyb=0,nb=0;

  memset(a,0,sizeof(*a));
  a->x0=x0;
  a->x1=x1;
  if(x1>=n)x1=n-1;

  for(i=x0;i<=x1;i++){
    int quantized=vorbis_dBquant(flr+i);
    if(quantized){
      if(mdct[i]+info->twofitatten>=flr[i]){
        xa  += i;
        ya  += quantized;
        x2a += i*i;
        y2a += quantized*quantized;
        xya += i*quantized;
        na++;
      }else{
        xb  += i;
        yb  += quantized;
        x2b += i*i;
        y2b += quantized*quantized;
        xyb += i*quantized;
        nb++;
      }
    }
  }

  a->xa=xa;
  a->ya=ya;
  a->x2a=x2a;
  a->y2a=y2a;
  a->xya=xya;
  a->an=na;

  a->xb=xb;
  a->yb=yb;
  a->x2b=x2b;
  a->y2b=y2b;
  a->xyb=xyb;
  a->bn=nb;

  return(na);
}